

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O0

int blake2s_init(blake2s_state *S,size_t outlen)

{
  undefined1 local_48 [8];
  blake2s_param P [1];
  size_t outlen_local;
  blake2s_state *S_local;
  
  if ((outlen == 0) || (0x20 < outlen)) {
    S_local._4_4_ = -1;
  }
  else {
    local_48[0] = (uint8_t)outlen;
    local_48[1] = '\0';
    local_48[2] = '\x01';
    local_48[3] = '\x01';
    store32(local_48 + 4,0);
    store32(P,0);
    store16(&P[0].leaf_length,0);
    P[0].leaf_length._2_1_ = 0;
    P[0].leaf_length._3_1_ = 0;
    memset(&P[0].node_offset,0,8);
    memset(P[0].salt,0,8);
    S_local._4_4_ = blake2s_init_param(S,(blake2s_param *)local_48);
  }
  return S_local._4_4_;
}

Assistant:

int blake2s_init( blake2s_state *S, size_t outlen )
{
  blake2s_param P[1];

  /* Move interval verification here? */
  if ( ( !outlen ) || ( outlen > BLAKE2S_OUTBYTES ) ) return -1;

  P->digest_length = (uint8_t)outlen;
  P->key_length    = 0;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store32( &P->node_offset, 0 );
  store16( &P->xof_length, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  /* memset(P->reserved, 0, sizeof(P->reserved) ); */
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );
  return blake2s_init_param( S, P );
}